

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdstring.cpp
# Opt level: O2

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)

{
  char cVar1;
  SQChar SVar2;
  int iVar3;
  SQRESULT SVar4;
  SQInteger SVar5;
  SQChar *pSVar6;
  SQInteger SVar7;
  long lVar8;
  longlong lVar9;
  size_t sVar10;
  SQChar *pSVar11;
  long lVar12;
  long lVar13;
  char *pcVar14;
  long lVar15;
  long lVar16;
  SQInteger ti;
  size_t local_a0;
  long local_98;
  SQFloat tf;
  long local_88;
  SQChar *ts;
  SQChar fmt [20];
  SQChar *format;
  long local_48;
  SQInteger *local_40;
  SQChar **local_38;
  
  SVar4 = sq_getstring(v,nformatstringidx,&format);
  if (SVar4 < 0) {
    return SVar4;
  }
  local_40 = outlen;
  local_38 = output;
  SVar5 = sq_getsize(v,nformatstringidx);
  local_a0 = SVar5 + 2;
  pSVar6 = sq_getscratchpad(v,local_a0);
  local_98 = 0;
  lVar12 = 0;
  lVar15 = 0;
LAB_0016113a:
  local_88 = nformatstringidx + 1;
  do {
    if (SVar5 <= lVar12) {
      *local_40 = lVar15;
      pSVar6[lVar15] = '\0';
      *local_38 = pSVar6;
      return 0;
    }
    if (format[lVar12] == '%') {
      if (format[lVar12 + 1] != '%') break;
      pSVar6[lVar15] = '%';
      lVar12 = lVar12 + 2;
    }
    else {
      pSVar6[lVar15] = format[lVar12];
      lVar12 = lVar12 + 1;
    }
    lVar15 = lVar15 + 1;
  } while( true );
  SVar7 = sq_gettop(v);
  pSVar6 = format;
  if (SVar7 <= nformatstringidx) {
    pcVar14 = "not enough parameters for the given format string";
    goto LAB_00161504;
  }
  lVar13 = lVar12 + 1;
  fmt[0] = '%';
  pcVar14 = format + lVar12 + 2;
  lVar12 = lVar12 + 2;
  lVar16 = lVar13;
  while (((ulong)(byte)format[lVar16] < 0x31 &&
         ((0x1280900000000U >> ((ulong)(byte)format[lVar16] & 0x3f) & 1) != 0))) {
    lVar16 = lVar16 + 1;
    lVar12 = lVar12 + 1;
    pcVar14 = pcVar14 + 1;
  }
  lVar8 = 0;
  do {
    if (9 < (int)format[lVar16] - 0x30U) {
      *(undefined1 *)((long)&ti + lVar8) = 0;
      if (lVar8 == 0) {
        local_98 = 0;
      }
      else {
        local_48 = lVar13;
        local_98 = strtoll((char *)&ti,&ts,10);
        lVar13 = local_48;
      }
      nformatstringidx = local_88;
      if (pSVar6[lVar16] != '.') goto LAB_001612ad;
      lVar8 = 0;
      goto LAB_00161248;
    }
    *(SQChar *)((long)&ti + lVar8) = format[lVar16];
    lVar16 = lVar16 + 1;
    lVar8 = lVar8 + 1;
    lVar12 = lVar12 + 1;
    pcVar14 = pcVar14 + 1;
  } while (lVar8 != 3);
  pcVar14 = "width format too long";
LAB_001612c8:
  lVar16 = sq_throwerror(v,pcVar14);
  nformatstringidx = local_88;
LAB_001612f1:
  if (lVar16 < 0) {
    return -1;
  }
  ts = (SQChar *)0x0;
  ti = 0;
  tf = 0.0;
  cVar1 = format[lVar16];
  switch(cVar1) {
  case 'd':
  case 'i':
  case 'o':
  case 'u':
  case 'x':
switchD_0016132e_caseD_64:
    sVar10 = strlen(fmt);
    SVar2 = fmt[sVar10 - 1];
    (fmt + (sVar10 - 1))[0] = 'l';
    (fmt + (sVar10 - 1))[1] = 'l';
    fmt[sVar10 + 1] = SVar2;
    fmt[sVar10 + 2] = '\0';
  case 'c':
    SVar4 = sq_getinteger(v,nformatstringidx,&ti);
    if (SVar4 < 0) {
      pcVar14 = "integer expected for the specified format";
LAB_00161504:
      SVar4 = sq_throwerror(v,pcVar14);
      return SVar4;
    }
    sVar10 = local_a0 + local_98 + 0x66;
    pSVar6 = sq_getscratchpad(v,sVar10);
    pSVar11 = (SQChar *)ti;
    local_a0 = sVar10;
    break;
  case 'e':
  case 'f':
  case 'g':
    goto switchD_0016132e_caseD_65;
  case 'h':
  case 'j':
  case 'k':
  case 'l':
  case 'm':
  case 'n':
  case 'p':
  case 'q':
  case 'r':
  case 't':
  case 'v':
  case 'w':
switchD_0016132e_caseD_68:
    pcVar14 = "invalid format";
    goto LAB_00161504;
  case 's':
    SVar4 = sq_getstring(v,nformatstringidx,&ts);
    if (SVar4 < 0) {
      pcVar14 = "string expected for the specified format";
      goto LAB_00161504;
    }
    SVar7 = sq_getsize(v,nformatstringidx);
    local_a0 = local_a0 + local_98 + SVar7 + 2;
    pSVar6 = sq_getscratchpad(v,local_a0);
    pSVar11 = ts;
    break;
  default:
    if ((cVar1 != 'E') && (cVar1 != 'G')) {
      if (cVar1 != 'X') goto switchD_0016132e_caseD_68;
      goto switchD_0016132e_caseD_64;
    }
    goto switchD_0016132e_caseD_65;
  }
  iVar3 = snprintf(pSVar6 + lVar15,local_a0,fmt,pSVar11);
  lVar15 = lVar15 + iVar3;
LAB_00161448:
  lVar12 = lVar16 + 1;
  goto LAB_0016113a;
LAB_00161248:
  if ((int)*pcVar14 - 0x30U < 10) goto code_r0x00161255;
  *(undefined1 *)((long)&ti + lVar8) = 0;
  lVar16 = lVar12;
  if (lVar8 != 0) {
    lVar9 = strtoll((char *)&ti,&ts,10);
    local_98 = local_98 + lVar9;
  }
LAB_001612ad:
  lVar12 = lVar16 - lVar13;
  if (0x14 < lVar12) {
    pcVar14 = "format too long";
    goto LAB_001612c8;
  }
  memcpy(fmt + 1,pSVar6 + lVar13,lVar12 + 1);
  fmt[lVar12 + 2] = '\0';
  nformatstringidx = local_88;
  goto LAB_001612f1;
code_r0x00161255:
  *(char *)((long)&ti + lVar8) = *pcVar14;
  lVar8 = lVar8 + 1;
  lVar12 = lVar12 + 1;
  pcVar14 = pcVar14 + 1;
  if (lVar8 == 3) goto code_r0x00161268;
  goto LAB_00161248;
code_r0x00161268:
  lVar16 = sq_throwerror(v,"precision format too long");
  goto LAB_001612f1;
switchD_0016132e_caseD_65:
  SVar4 = sq_getfloat(v,nformatstringidx,&tf);
  if (SVar4 < 0) {
    pcVar14 = "float expected for the specified format";
    goto LAB_00161504;
  }
  sVar10 = local_a0 + local_98 + 0x66;
  pSVar6 = sq_getscratchpad(v,sVar10);
  local_a0 = sVar10;
  for (iVar3 = snprintf(pSVar6 + lVar15,sVar10,fmt,(double)tf); 0 < iVar3; iVar3 = iVar3 + -1) {
    if (pSVar6[lVar15] == ',') {
      pSVar6[lVar15] = '.';
    }
    lVar15 = lVar15 + 1;
  }
  goto LAB_00161448;
}

Assistant:

SQRESULT sqstd_format(HSQUIRRELVM v,SQInteger nformatstringidx,SQInteger *outlen,SQChar **output)
{
    const SQChar *format;
    SQChar *dest;
    SQChar fmt[MAX_FORMAT_LEN];
    const SQRESULT res = sq_getstring(v,nformatstringidx,&format);
    if (SQ_FAILED(res)) {
        return res; // propagate the error
    }
    SQInteger format_size = sq_getsize(v,nformatstringidx);
    SQInteger allocated = (format_size+2)*sizeof(SQChar);
    dest = sq_getscratchpad(v,allocated);
    SQInteger n = 0,i = 0, nparam = nformatstringidx+1, w = 0;
    //while(format[n] != '\0')
    while(n < format_size)
    {
        if(format[n] != '%') {
            assert(i < allocated);
            dest[i++] = format[n];
            n++;
        }
        else if(format[n+1] == '%') { //handles %%
                dest[i++] = '%';
                n += 2;
        }
        else {
            n++;
            if( nparam > sq_gettop(v) )
                return sq_throwerror(v,_SC("not enough parameters for the given format string"));
            n = validate_format(v,fmt,format,n,w);
            if(n < 0) return -1;
            SQInteger addlen = 0;
            SQInteger valtype = 0;
            const SQChar *ts = NULL;
            SQInteger ti = 0;
            SQFloat tf = 0;
            switch(format[n]) {
            case 's':
                if(SQ_FAILED(sq_getstring(v,nparam,&ts)))
                    return sq_throwerror(v,_SC("string expected for the specified format"));
                addlen = (sq_getsize(v,nparam)*sizeof(SQChar))+((w+1)*sizeof(SQChar));
                valtype = 's';
                break;
            case 'i': case 'd': case 'o': case 'u':  case 'x':  case 'X':
#ifdef _SQ64
                {
                size_t flen = strlen(fmt);
                SQInteger fpos = flen - 1;
                SQChar f = fmt[fpos];
                const SQChar *prec = (const SQChar *)_PRINT_INT_PREC;
                while(*prec != _SC('\0')) {
                    fmt[fpos++] = *prec++;
                }
                fmt[fpos++] = f;
                fmt[fpos++] = _SC('\0');
                }
#endif
            case 'c':
                if(SQ_FAILED(sq_getinteger(v,nparam,&ti)))
                    return sq_throwerror(v,_SC("integer expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'i';
                break;
            case 'f': case 'g': case 'G': case 'e':  case 'E':
                if(SQ_FAILED(sq_getfloat(v,nparam,&tf)))
                    return sq_throwerror(v,_SC("float expected for the specified format"));
                addlen = (ADDITIONAL_FORMAT_SPACE)+((w+1)*sizeof(SQChar));
                valtype = 'f';
                break;
            default:
                return sq_throwerror(v,_SC("invalid format"));
            }
            n++;
            allocated += addlen + sizeof(SQChar);
            dest = sq_getscratchpad(v,allocated);
            switch(valtype) {
            case 's': i += scsprintf(&dest[i],allocated,fmt,ts); break;
            case 'i': i += scsprintf(&dest[i],allocated,fmt,ti); break;
            case 'f': {
                int len = scsprintf(&dest[i], allocated, fmt, tf);
                for (; len > 0; len--, i++)
                    if (dest[i] == ',')
                        dest[i] = '.';
                break;
                }
            };
            nparam ++;
        }
    }
    *outlen = i;
    dest[i] = '\0';
    *output = dest;
    return SQ_OK;
}